

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

string * __thiscall
cmCPackGenerator::FindTemplate_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackGenerator *this,char *name)

{
  cmCPackLog *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  char *__s;
  ostringstream cmCPackLog_msg;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Look for template: ",0x13);
  __s = "(NULL)";
  if (name != (char *)0x0) {
    __s = name;
  }
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar2);
  std::ios::widen((char)(ostream *)local_1a0 + (char)*(_func_int **)(local_1a0._0_8_ + -0x18));
  std::ostream::put((char)local_1a0);
  std::ostream::flush();
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  sVar2 = strlen((char *)local_1c0);
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x504,(char *)local_1c0,sVar2);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  cmMakefile::GetModulesFile_abi_cxx11_(__return_storage_ptr__,this->MakefileMap,name);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Found template: ",0x10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(__return_storage_ptr__->_M_dataplus)._M_p,
                      __return_storage_ptr__->_M_string_length);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  sVar2 = strlen((char *)local_1c0);
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x507,(char *)local_1c0,sVar2);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::FindTemplate(const char* name)
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Look for template: "
    << (name ? name : "(NULL)") << std::endl);
  std::string ffile = this->MakefileMap->GetModulesFile(name);
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Found template: "
    << ffile << std::endl);
  return ffile;
}